

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O1

void test_bus_recv_cancel(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_socket local_34;
  nng_aio *pnStack_30;
  nng_socket s1;
  nng_aio *aio;
  
  nVar1 = nng_bus0_open(&local_34);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x96,"%s: expected success, got %s (%d)","nng_bus0_open(&s1)",pcVar3,nVar1
                        );
  if (iVar2 != 0) {
    nVar1 = nng_aio_alloc(&stack0xffffffffffffffd0,(_func_void_void_ptr *)0x0,(void *)0x0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                           ,0x97,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&aio, NULL, NULL)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nng_aio_set_timeout(pnStack_30,1000);
      nng_socket_recv(local_34,pnStack_30);
      nng_aio_abort(pnStack_30,NNG_ECANCELED);
      nng_aio_wait(pnStack_30);
      nVar1 = nng_aio_result(pnStack_30);
      pcVar3 = nng_strerror(NNG_ECANCELED);
      acutest_check_((uint)(nVar1 == NNG_ECANCELED),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                     ,0x9e,"%s fails with %s","nng_aio_result(aio)",pcVar3);
      pcVar3 = nng_strerror(NNG_ECANCELED);
      pcVar4 = nng_strerror(nVar1);
      acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio)",pcVar3,0x14,pcVar4,
                       (ulong)nVar1);
      nVar1 = nng_socket_close(local_34);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                             ,0x9f,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3
                             ,nVar1);
      if (iVar2 != 0) {
        nng_aio_free(pnStack_30);
        return;
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_bus_recv_cancel(void)
{
	nng_socket s1;
	nng_aio   *aio;

	NUTS_PASS(nng_bus0_open(&s1));
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));

	nng_aio_set_timeout(aio, SECOND);
	nng_socket_recv(s1, aio);
	nng_aio_abort(aio, NNG_ECANCELED);

	nng_aio_wait(aio);
	NUTS_FAIL(nng_aio_result(aio), NNG_ECANCELED);
	NUTS_CLOSE(s1);
	nng_aio_free(aio);
}